

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

vector<example::aln_t,_std::allocator<example::aln_t>_> * __thiscall
rangeless::fn::impl::
sort_by<example::filter_to_unique_cds_for_gene(std::vector<example::aln_t,std::allocator<example::aln_t>>)::$_0,rangeless::fn::impl::stable_sort_tag>
::operator()(vector<example::aln_t,_std::allocator<example::aln_t>_> *__return_storage_ptr__,
            sort_by<example::filter_to_unique_cds_for_gene(std::vector<example::aln_t,std::allocator<example::aln_t>>)::__0,rangeless::fn::impl::stable_sort_tag>
            *this,vector<example::aln_t,_std::allocator<example::aln_t>_> *src)

{
  vector<example::aln_t,_std::allocator<example::aln_t>_> *src_local;
  sort_by<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:275:17),_rangeless::fn::impl::stable_sort_tag>
  *this_local;
  
  require_iterator_category_at_least<std::random_access_iterator_tag,std::vector<example::aln_t,std::allocator<example::aln_t>>>
            (src);
  operator()(src,this);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::vector(__return_storage_ptr__,src);
  return __return_storage_ptr__;
}

Assistant:

Iterable operator()(Iterable src) const
        {
            impl::require_iterator_category_at_least<std::random_access_iterator_tag>(src);

            // this will fire if Iterable is std::map, where value_type is std::pair<const Key, Value>,
            // which is not move-assignable because of constness.
            static_assert(std::is_move_assignable<typename Iterable::value_type>::value, "value_type must be move-assignable.");

            s_sort( src, 
                    [this](const typename Iterable::value_type& x, 
                           const typename Iterable::value_type& y)
                    {
                        return lt{}(key_fn(x), key_fn(y));
                    }
                    , SortTag{});

            return src;
        }